

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_parse_result *
pugi::impl::anon_unknown_0::load_buffer_impl
          (xml_parse_result *__return_storage_ptr__,xml_document_struct *doc,xml_node_struct *root,
          void *contents,size_t size,uint options,xml_encoding encoding,bool is_mutable,bool own,
          char_t **out_buffer)

{
  xml_node_struct *pxVar1;
  byte endch;
  char cVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  bool bVar24;
  xml_encoding xVar25;
  undefined8 in_RAX;
  undefined4 extraout_var_00;
  undefined7 extraout_var;
  xml_node_struct *pxVar26;
  long lVar27;
  xml_attribute_struct *pxVar28;
  xml_node_struct *pxVar29;
  char_t *pcVar30;
  xml_node_struct *pxVar31;
  xml_node_struct **ppxVar32;
  byte bVar33;
  byte bVar34;
  ushort uVar35;
  uint uVar36;
  uint uVar37;
  char *__function;
  ulong uVar38;
  byte *pbVar39;
  byte *pbVar40;
  ushort *puVar41;
  ushort *puVar42;
  undefined2 *puVar43;
  long lVar44;
  ulong uVar45;
  xml_allocator *alloc;
  ushort uVar46;
  byte bVar47;
  xml_parse_status xVar48;
  xml_parse_status xVar49;
  size_t sVar50;
  xml_node_struct *pxVar51;
  undefined2 *puVar52;
  xml_node_struct *pxVar53;
  ulong uVar54;
  undefined1 auVar58 [32];
  undefined1 auVar60 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 in_ZMM8 [64];
  undefined1 in_ZMM9 [64];
  char_t *buffer;
  xml_node_struct *local_a8;
  xml_node_struct *local_a0;
  xml_node_struct *local_98;
  xml_node_struct *local_90;
  xml_node_struct *local_88;
  uint local_7c;
  gap local_78;
  xml_node_struct *local_68;
  undefined8 local_60;
  xml_node_struct **local_58;
  code *local_50;
  code *local_48;
  xml_node_struct *local_40;
  xml_node_struct *local_38;
  undefined1 auVar57 [32];
  undefined1 auVar59 [32];
  
  auVar56 = in_ZMM3._0_16_;
  if (size != 0 && contents == (void *)0x0) {
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    __return_storage_ptr__->offset = 0;
    return (xml_parse_result *)CONCAT71((int7)((ulong)in_RAX >> 8),contents != (void *)0x0);
  }
  xVar25 = get_buffer_encoding(encoding,contents,size);
  local_60 = CONCAT44(extraout_var_00,xVar25);
  local_a0 = (xml_node_struct *)0x0;
  local_a8 = (xml_node_struct *)0x0;
  local_88 = root;
  if (xVar25 == encoding_utf8) goto LAB_00106625;
  if ((xVar25 & ~encoding_utf8) == encoding_utf16_le) {
    uVar45 = size >> 1;
    lVar27 = 0;
    if (xVar25 == encoding_utf16_le) {
      uVar38 = uVar45;
      puVar41 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar35 = *puVar41;
          if (uVar35 < 0xd800) {
            lVar44 = 3 - (ulong)(uVar35 < 0x800);
            if (uVar35 < 0x80) {
              lVar44 = 1;
            }
            lVar27 = lVar27 + lVar44;
LAB_001067b5:
            puVar42 = puVar41 + 1;
            lVar44 = -1;
          }
          else {
            if ((~uVar35 & 0xe000) == 0) {
              lVar27 = lVar27 + 3;
              goto LAB_001067b5;
            }
            puVar42 = puVar41 + 1;
            lVar44 = -1;
            if (((uVar38 != 1) && ((uVar35 & 0xfc00) == 0xd800)) && ((*puVar42 & 0xfc00) == 0xdc00))
            {
              lVar27 = lVar27 + 4;
              puVar42 = puVar41 + 2;
              lVar44 = -2;
            }
          }
          uVar38 = uVar38 + lVar44;
          puVar41 = puVar42;
        } while (uVar38 != 0);
      }
      pxVar31 = (xml_node_struct *)(lVar27 + 1);
      pxVar26 = (xml_node_struct *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(pxVar31);
      if (pxVar26 == (xml_node_struct *)0x0) goto LAB_00106646;
      pxVar53 = pxVar26;
      puVar41 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar35 = *puVar41;
          uVar37 = (uint)uVar35;
          if ((uVar35 < 0xd800) || ((~uVar35 & 0xe000) == 0)) {
            pxVar53 = (xml_node_struct *)utf8_writer::low((value_type)pxVar53,uVar37);
            puVar42 = puVar41 + 1;
            lVar44 = -1;
          }
          else {
            puVar42 = puVar41 + 1;
            lVar44 = -1;
            if ((uVar45 != 1) && ((uVar37 & 0xfc00) == 0xd800)) {
              uVar35 = *puVar42;
              if ((uVar35 & 0xfc00) == 0xdc00) {
                puVar42 = puVar41 + 2;
                uVar36 = (uVar37 << 10 & 0xffc00) + 0x10000;
                auVar56 = vpinsrb_avx(ZEXT416(uVar36 >> 0x12),uVar36 >> 0xc & 0xffffff3f,1);
                lVar44 = -2;
                auVar56 = vpinsrb_avx(auVar56,(uVar35 & 0x3c0 | uVar37 << 10 & 0xffffcfc0) >> 6,2);
                auVar56 = vpinsrb_avx(auVar56,uVar35 & 0xffffff3f,3);
                auVar20._8_4_ = 0x808080f0;
                auVar20._0_8_ = 0x808080f0808080f0;
                auVar20._12_4_ = 0x808080f0;
                auVar56 = vpord_avx512vl(auVar56,auVar20);
                *(int *)&pxVar53->header = auVar56._0_4_;
                pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 4);
              }
            }
          }
          uVar45 = uVar45 + lVar44;
          puVar41 = puVar42;
        } while (uVar45 != 0);
      }
      if (pxVar53 != (xml_node_struct *)((long)&pxVar26->header + lVar27)) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
        ;
LAB_00107f74:
        __assert_fail("oend == obegin + length",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                      ,0x88e,__function);
      }
    }
    else {
      uVar38 = uVar45;
      puVar41 = (ushort *)contents;
      if (1 < size) {
        do {
          uVar35 = swap_bytes(*puVar41);
          if (uVar35 < 0xd800) {
            lVar44 = 3 - (ulong)(uVar35 < 0x800);
            if (uVar35 < 0x80) {
              lVar44 = 1;
            }
            lVar27 = lVar27 + lVar44;
LAB_0010686e:
            puVar42 = puVar41 + 1;
            lVar44 = -1;
          }
          else {
            if ((~uVar35 & 0xe000) == 0) {
              lVar27 = lVar27 + 3;
              goto LAB_0010686e;
            }
            puVar42 = puVar41 + 1;
            lVar44 = -1;
            if (((uVar38 != 1) && ((uVar35 & 0xfc00) == 0xd800)) && ((*puVar42 & 0xfc) == 0xdc)) {
              lVar27 = lVar27 + 4;
              puVar42 = puVar41 + 2;
              lVar44 = -2;
            }
          }
          uVar38 = uVar38 + lVar44;
          puVar41 = puVar42;
        } while (uVar38 != 0);
      }
      pxVar31 = (xml_node_struct *)(lVar27 + 1);
      pxVar26 = (xml_node_struct *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(pxVar31);
      if (pxVar26 == (xml_node_struct *)0x0) goto LAB_00106646;
      pxVar53 = pxVar26;
      puVar52 = (undefined2 *)contents;
      if (1 < size) {
        do {
          uVar35 = swap_bytes(*puVar52);
          uVar37 = (uint)uVar35;
          if ((uVar35 < 0xd800) || ((~uVar37 & 0xe000) == 0)) {
            pxVar53 = (xml_node_struct *)utf8_writer::low((value_type)pxVar53,uVar37);
            puVar43 = puVar52 + 1;
            lVar44 = -1;
          }
          else {
            puVar43 = puVar52 + 1;
            lVar44 = -1;
            if ((uVar45 != 1) && ((uVar37 & 0xfc00) == 0xd800)) {
              uVar46 = swap_bytes(*puVar43);
              if ((uVar46 & 0xfc00) == 0xdc00) {
                puVar43 = puVar52 + 2;
                uVar37 = ((uint)uVar35 << 10 & 0xffc00) + 0x10000;
                auVar56 = vpinsrb_avx(ZEXT416(uVar37 >> 0x12),uVar37 >> 0xc & 0xffffff3f,1);
                lVar44 = -2;
                auVar56 = vpinsrb_avx(auVar56,(uVar46 & 0x3c0 | (uint)uVar35 << 10 & 0xffffcfc0) >>
                                              6,2);
                auVar56 = vpinsrb_avx(auVar56,uVar46 & 0xffffff3f,3);
                auVar21._8_4_ = 0x808080f0;
                auVar21._0_8_ = 0x808080f0808080f0;
                auVar21._12_4_ = 0x808080f0;
                auVar56 = vpord_avx512vl(auVar56,auVar21);
                *(int *)&pxVar53->header = auVar56._0_4_;
                pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 4);
              }
            }
          }
          uVar45 = uVar45 + lVar44;
          puVar52 = puVar43;
        } while (uVar45 != 0);
      }
      if (pxVar53 != (xml_node_struct *)((long)&pxVar26->header + lVar27)) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf16_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
        ;
        goto LAB_00107f74;
      }
    }
    *(byte *)&pxVar53->header = 0;
    local_a8 = pxVar31;
    local_a0 = pxVar26;
  }
  else if (xVar25 - encoding_utf32_le < 2) {
    uVar45 = size >> 2;
    if (xVar25 == encoding_utf32_le) {
      if (size < 4) {
        lVar27 = 0;
      }
      else {
        auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar59._8_4_ = 0xffff;
        auVar59._0_8_ = 0xffff0000ffff;
        auVar59._12_4_ = 0xffff;
        auVar59._16_4_ = 0xffff;
        auVar59._20_4_ = 0xffff;
        auVar59._24_4_ = 0xffff;
        auVar59._28_4_ = 0xffff;
        auVar72._8_4_ = 0x80;
        auVar72._0_8_ = 0x8000000080;
        auVar72._12_4_ = 0x80;
        auVar72._16_4_ = 0x80;
        auVar72._20_4_ = 0x80;
        auVar72._24_4_ = 0x80;
        auVar72._28_4_ = 0x80;
        auVar75._8_4_ = 0x800;
        auVar75._0_8_ = 0x80000000800;
        auVar75._12_4_ = 0x800;
        auVar75._16_4_ = 0x800;
        auVar75._20_4_ = 0x800;
        auVar75._24_4_ = 0x800;
        auVar75._28_4_ = 0x800;
        auVar62 = vpbroadcastq_avx512f(ZEXT816(3));
        auVar77 = ZEXT1664((undefined1  [16])0x0);
        auVar63 = vpbroadcastq_avx512f();
        uVar38 = 0;
        do {
          auVar64 = vpbroadcastq_avx512f();
          auVar65 = vmovdqa64_avx512f(auVar77);
          auVar77 = vporq_avx512f(auVar64,auVar61);
          uVar19 = vpcmpuq_avx512f(auVar77,auVar63,2);
          auVar57 = vmovdqu32_avx512vl(*(undefined1 (*) [32])((long)contents + uVar38 * 4));
          auVar58._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar57._4_4_;
          auVar58._0_4_ = (uint)((byte)uVar19 & 1) * auVar57._0_4_;
          auVar58._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar57._8_4_;
          auVar58._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar57._12_4_;
          auVar58._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar57._16_4_;
          auVar58._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar57._20_4_;
          auVar58._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar57._24_4_;
          auVar58._28_4_ = (uint)(byte)(uVar19 >> 7) * auVar57._28_4_;
          uVar38 = uVar38 + 8;
          uVar17 = vpcmpud_avx512vl(auVar58,auVar75,1);
          auVar66._8_4_ = 2;
          auVar66._0_8_ = 2;
          auVar66._12_4_ = 0;
          auVar66._16_8_ = 2;
          auVar66._24_8_ = 2;
          auVar66._32_8_ = 2;
          auVar66._40_8_ = 2;
          auVar66._48_8_ = 2;
          auVar66._56_8_ = 2;
          auVar77 = vpblendmq_avx512f(auVar62,auVar66);
          bVar24 = (bool)((byte)uVar17 & 1);
          bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
          lVar27 = in_ZMM8._8_8_;
          bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
          lVar44 = in_ZMM8._16_8_;
          bVar9 = (bool)((byte)(uVar17 >> 3) & 1);
          lVar67 = in_ZMM8._24_8_;
          bVar11 = (bool)((byte)(uVar17 >> 4) & 1);
          lVar68 = in_ZMM8._32_8_;
          bVar13 = (bool)((byte)(uVar17 >> 5) & 1);
          lVar69 = in_ZMM8._40_8_;
          bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
          lVar70 = in_ZMM8._48_8_;
          lVar71 = in_ZMM8._56_8_;
          uVar18 = vpcmpud_avx512vl(auVar58,auVar72,1);
          uVar54 = vpcmpud_avx512vl(auVar58,auVar59,6);
          uVar54 = uVar19 & uVar54;
          auVar64 = vpbroadcastq_avx512f(ZEXT816(1));
          bVar3 = (bool)((byte)uVar18 & 1);
          bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar18 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar18 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar18 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar18 >> 5) & 1);
          bVar16 = (bool)((byte)(uVar18 >> 6) & 1);
          auVar66 = vpbroadcastq_avx512f(ZEXT816(4));
          bVar4 = (bool)((byte)uVar54 & 1);
          in_ZMM8._0_8_ =
               (ulong)bVar4 * auVar66._0_8_ |
               (ulong)!bVar4 *
               ((ulong)bVar3 * auVar64._0_8_ |
               (ulong)!bVar3 * ((ulong)bVar24 * auVar77._0_8_ | (ulong)!bVar24 * in_ZMM8._0_8_));
          bVar24 = (bool)((byte)(uVar54 >> 1) & 1);
          in_ZMM8._8_8_ =
               (ulong)bVar24 * auVar66._8_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar6 * auVar64._8_8_ |
               (ulong)!bVar6 * ((ulong)bVar5 * auVar77._8_8_ | (ulong)!bVar5 * lVar27));
          bVar24 = (bool)((byte)(uVar54 >> 2) & 1);
          in_ZMM8._16_8_ =
               (ulong)bVar24 * auVar66._16_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar8 * auVar64._16_8_ |
               (ulong)!bVar8 * ((ulong)bVar7 * auVar77._16_8_ | (ulong)!bVar7 * lVar44));
          bVar24 = (bool)((byte)(uVar54 >> 3) & 1);
          in_ZMM8._24_8_ =
               (ulong)bVar24 * auVar66._24_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar10 * auVar64._24_8_ |
               (ulong)!bVar10 * ((ulong)bVar9 * auVar77._24_8_ | (ulong)!bVar9 * lVar67));
          bVar24 = (bool)((byte)(uVar54 >> 4) & 1);
          in_ZMM8._32_8_ =
               (ulong)bVar24 * auVar66._32_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar12 * auVar64._32_8_ |
               (ulong)!bVar12 * ((ulong)bVar11 * auVar77._32_8_ | (ulong)!bVar11 * lVar68));
          bVar24 = (bool)((byte)(uVar54 >> 5) & 1);
          in_ZMM8._40_8_ =
               (ulong)bVar24 * auVar66._40_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar14 * auVar64._40_8_ |
               (ulong)!bVar14 * ((ulong)bVar13 * auVar77._40_8_ | (ulong)!bVar13 * lVar69));
          bVar24 = (bool)((byte)(uVar54 >> 6) & 1);
          in_ZMM8._48_8_ =
               (ulong)bVar24 * auVar66._48_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar16 * auVar64._48_8_ |
               (ulong)!bVar16 * ((ulong)bVar15 * auVar77._48_8_ | (ulong)!bVar15 * lVar70));
          in_ZMM8._56_8_ =
               (uVar54 >> 7) * auVar66._56_8_ |
               (ulong)!SUB81(uVar54 >> 7,0) *
               ((uVar18 >> 7) * auVar64._56_8_ |
               (ulong)!SUB81(uVar18 >> 7,0) *
               ((uVar17 >> 7) * auVar77._56_8_ | (ulong)!SUB81(uVar17 >> 7,0) * lVar71));
          auVar77 = vpaddq_avx512f(auVar65,in_ZMM8);
        } while ((uVar45 + 7 & 0xfffffffffffffff8) != uVar38);
        auVar61 = vmovdqa64_avx512f(auVar77);
        bVar24 = (bool)((byte)uVar19 & 1);
        auVar63._0_8_ = (ulong)bVar24 * auVar61._0_8_ | (ulong)!bVar24 * auVar65._0_8_;
        bVar24 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar63._8_8_ = (ulong)bVar24 * auVar61._8_8_ | (ulong)!bVar24 * auVar65._8_8_;
        bVar24 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar63._16_8_ = (ulong)bVar24 * auVar61._16_8_ | (ulong)!bVar24 * auVar65._16_8_;
        bVar24 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar63._24_8_ = (ulong)bVar24 * auVar61._24_8_ | (ulong)!bVar24 * auVar65._24_8_;
        bVar24 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar63._32_8_ = (ulong)bVar24 * auVar61._32_8_ | (ulong)!bVar24 * auVar65._32_8_;
        bVar24 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar63._40_8_ = (ulong)bVar24 * auVar61._40_8_ | (ulong)!bVar24 * auVar65._40_8_;
        bVar24 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar63._48_8_ = (ulong)bVar24 * auVar61._48_8_ | (ulong)!bVar24 * auVar65._48_8_;
        auVar63._56_8_ =
             (uVar19 >> 7) * auVar61._56_8_ | (ulong)!SUB81(uVar19 >> 7,0) * auVar65._56_8_;
        auVar57 = vextracti64x4_avx512f(auVar63,1);
        auVar61 = vpaddq_avx512f(auVar63,ZEXT3264(auVar57));
        auVar56 = vpaddq_avx(auVar61._0_16_,auVar61._16_16_);
        auVar55 = vpshufd_avx(auVar56,0xee);
        auVar56 = vpaddq_avx(auVar56,auVar55);
        lVar27 = auVar56._0_8_;
      }
      pxVar31 = (xml_node_struct *)(lVar27 + 1);
      pxVar26 = (xml_node_struct *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(pxVar31);
      if (pxVar26 == (xml_node_struct *)0x0) goto LAB_00106646;
      pxVar53 = pxVar26;
      if (3 < size) {
        uVar38 = 0;
        do {
          uVar37 = *(uint *)((long)contents + uVar38 * 4);
          if (uVar37 < 0x10000) {
            pxVar53 = (xml_node_struct *)utf8_writer::low((value_type)pxVar53,uVar37);
          }
          else {
            auVar56 = vpinsrb_avx(ZEXT416(uVar37 >> 0x12),uVar37 >> 0xc & 0xfff3f,1);
            auVar56 = vpinsrb_avx(auVar56,uVar37 >> 6 & 0x3ffff3f,2);
            auVar56 = vpinsrb_avx(auVar56,uVar37 & 0xffffff3f,3);
            auVar22._8_4_ = 0x808080f0;
            auVar22._0_8_ = 0x808080f0808080f0;
            auVar22._12_4_ = 0x808080f0;
            auVar56 = vpord_avx512vl(auVar56,auVar22);
            *(int *)&pxVar53->header = auVar56._0_4_;
            pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 4);
          }
          uVar38 = uVar38 + 1;
        } while (uVar45 != uVar38);
      }
      if (pxVar53 != (xml_node_struct *)((long)&pxVar26->header + lVar27)) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_false>]"
        ;
        goto LAB_00107f74;
      }
    }
    else {
      if (size < 4) {
        lVar27 = 0;
      }
      else {
        auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar57._16_16_ = _DAT_00117b90;
        auVar57._0_16_ = _DAT_00117b90;
        auVar73._8_4_ = 0xffff;
        auVar73._0_8_ = 0xffff0000ffff;
        auVar73._12_4_ = 0xffff;
        auVar73._16_4_ = 0xffff;
        auVar73._20_4_ = 0xffff;
        auVar73._24_4_ = 0xffff;
        auVar73._28_4_ = 0xffff;
        auVar74._8_4_ = 0x80;
        auVar74._0_8_ = 0x8000000080;
        auVar74._12_4_ = 0x80;
        auVar74._16_4_ = 0x80;
        auVar74._20_4_ = 0x80;
        auVar74._24_4_ = 0x80;
        auVar74._28_4_ = 0x80;
        auVar76._8_4_ = 0x800;
        auVar76._0_8_ = 0x80000000800;
        auVar76._12_4_ = 0x800;
        auVar76._16_4_ = 0x800;
        auVar76._20_4_ = 0x800;
        auVar76._24_4_ = 0x800;
        auVar76._28_4_ = 0x800;
        auVar62 = vpbroadcastq_avx512f(ZEXT816(3));
        auVar77 = ZEXT1664((undefined1  [16])0x0);
        auVar63 = vpbroadcastq_avx512f();
        uVar38 = 0;
        do {
          auVar64 = vpbroadcastq_avx512f();
          auVar66 = vmovdqa64_avx512f(auVar77);
          auVar77 = vporq_avx512f(auVar64,auVar61);
          uVar19 = vpcmpuq_avx512f(auVar77,auVar63,2);
          auVar59 = vmovdqu32_avx512vl(*(undefined1 (*) [32])((long)contents + uVar38 * 4));
          auVar60._4_4_ = (uint)((byte)(uVar19 >> 1) & 1) * auVar59._4_4_;
          auVar60._0_4_ = (uint)((byte)uVar19 & 1) * auVar59._0_4_;
          auVar60._8_4_ = (uint)((byte)(uVar19 >> 2) & 1) * auVar59._8_4_;
          auVar60._12_4_ = (uint)((byte)(uVar19 >> 3) & 1) * auVar59._12_4_;
          auVar60._16_4_ = (uint)((byte)(uVar19 >> 4) & 1) * auVar59._16_4_;
          auVar60._20_4_ = (uint)((byte)(uVar19 >> 5) & 1) * auVar59._20_4_;
          auVar60._24_4_ = (uint)((byte)(uVar19 >> 6) & 1) * auVar59._24_4_;
          auVar60._28_4_ = (uint)(byte)(uVar19 >> 7) * auVar59._28_4_;
          uVar38 = uVar38 + 8;
          auVar59 = vpshufb_avx2(auVar60,auVar57);
          uVar17 = vpcmpud_avx512vl(auVar59,auVar76,1);
          auVar65._8_4_ = 2;
          auVar65._0_8_ = 2;
          auVar65._12_4_ = 0;
          auVar65._16_8_ = 2;
          auVar65._24_8_ = 2;
          auVar65._32_8_ = 2;
          auVar65._40_8_ = 2;
          auVar65._48_8_ = 2;
          auVar65._56_8_ = 2;
          auVar77 = vpblendmq_avx512f(auVar62,auVar65);
          bVar24 = (bool)((byte)uVar17 & 1);
          bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
          lVar27 = in_ZMM9._8_8_;
          bVar7 = (bool)((byte)(uVar17 >> 2) & 1);
          lVar44 = in_ZMM9._16_8_;
          bVar9 = (bool)((byte)(uVar17 >> 3) & 1);
          lVar67 = in_ZMM9._24_8_;
          bVar11 = (bool)((byte)(uVar17 >> 4) & 1);
          lVar68 = in_ZMM9._32_8_;
          bVar13 = (bool)((byte)(uVar17 >> 5) & 1);
          lVar69 = in_ZMM9._40_8_;
          bVar15 = (bool)((byte)(uVar17 >> 6) & 1);
          lVar70 = in_ZMM9._48_8_;
          lVar71 = in_ZMM9._56_8_;
          uVar18 = vpcmpud_avx512vl(auVar59,auVar74,1);
          uVar54 = vpcmpud_avx512vl(auVar59,auVar73,6);
          uVar54 = uVar19 & uVar54;
          auVar64 = vpbroadcastq_avx512f(ZEXT816(1));
          bVar3 = (bool)((byte)uVar18 & 1);
          bVar6 = (bool)((byte)(uVar18 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar18 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar18 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar18 >> 4) & 1);
          bVar14 = (bool)((byte)(uVar18 >> 5) & 1);
          bVar16 = (bool)((byte)(uVar18 >> 6) & 1);
          auVar65 = vpbroadcastq_avx512f(ZEXT816(4));
          bVar4 = (bool)((byte)uVar54 & 1);
          in_ZMM9._0_8_ =
               (ulong)bVar4 * auVar65._0_8_ |
               (ulong)!bVar4 *
               ((ulong)bVar3 * auVar64._0_8_ |
               (ulong)!bVar3 * ((ulong)bVar24 * auVar77._0_8_ | (ulong)!bVar24 * in_ZMM9._0_8_));
          bVar24 = (bool)((byte)(uVar54 >> 1) & 1);
          in_ZMM9._8_8_ =
               (ulong)bVar24 * auVar65._8_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar6 * auVar64._8_8_ |
               (ulong)!bVar6 * ((ulong)bVar5 * auVar77._8_8_ | (ulong)!bVar5 * lVar27));
          bVar24 = (bool)((byte)(uVar54 >> 2) & 1);
          in_ZMM9._16_8_ =
               (ulong)bVar24 * auVar65._16_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar8 * auVar64._16_8_ |
               (ulong)!bVar8 * ((ulong)bVar7 * auVar77._16_8_ | (ulong)!bVar7 * lVar44));
          bVar24 = (bool)((byte)(uVar54 >> 3) & 1);
          in_ZMM9._24_8_ =
               (ulong)bVar24 * auVar65._24_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar10 * auVar64._24_8_ |
               (ulong)!bVar10 * ((ulong)bVar9 * auVar77._24_8_ | (ulong)!bVar9 * lVar67));
          bVar24 = (bool)((byte)(uVar54 >> 4) & 1);
          in_ZMM9._32_8_ =
               (ulong)bVar24 * auVar65._32_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar12 * auVar64._32_8_ |
               (ulong)!bVar12 * ((ulong)bVar11 * auVar77._32_8_ | (ulong)!bVar11 * lVar68));
          bVar24 = (bool)((byte)(uVar54 >> 5) & 1);
          in_ZMM9._40_8_ =
               (ulong)bVar24 * auVar65._40_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar14 * auVar64._40_8_ |
               (ulong)!bVar14 * ((ulong)bVar13 * auVar77._40_8_ | (ulong)!bVar13 * lVar69));
          bVar24 = (bool)((byte)(uVar54 >> 6) & 1);
          in_ZMM9._48_8_ =
               (ulong)bVar24 * auVar65._48_8_ |
               (ulong)!bVar24 *
               ((ulong)bVar16 * auVar64._48_8_ |
               (ulong)!bVar16 * ((ulong)bVar15 * auVar77._48_8_ | (ulong)!bVar15 * lVar70));
          in_ZMM9._56_8_ =
               (uVar54 >> 7) * auVar65._56_8_ |
               (ulong)!SUB81(uVar54 >> 7,0) *
               ((uVar18 >> 7) * auVar64._56_8_ |
               (ulong)!SUB81(uVar18 >> 7,0) *
               ((uVar17 >> 7) * auVar77._56_8_ | (ulong)!SUB81(uVar17 >> 7,0) * lVar71));
          auVar77 = vpaddq_avx512f(auVar66,in_ZMM9);
        } while ((uVar45 + 7 & 0xfffffffffffffff8) != uVar38);
        auVar62 = vmovdqa64_avx512f(auVar77);
        bVar24 = (bool)((byte)uVar19 & 1);
        auVar61._0_8_ = (ulong)bVar24 * auVar62._0_8_ | (ulong)!bVar24 * auVar66._0_8_;
        bVar24 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar61._8_8_ = (ulong)bVar24 * auVar62._8_8_ | (ulong)!bVar24 * auVar66._8_8_;
        bVar24 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar61._16_8_ = (ulong)bVar24 * auVar62._16_8_ | (ulong)!bVar24 * auVar66._16_8_;
        bVar24 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar61._24_8_ = (ulong)bVar24 * auVar62._24_8_ | (ulong)!bVar24 * auVar66._24_8_;
        bVar24 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar61._32_8_ = (ulong)bVar24 * auVar62._32_8_ | (ulong)!bVar24 * auVar66._32_8_;
        bVar24 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar61._40_8_ = (ulong)bVar24 * auVar62._40_8_ | (ulong)!bVar24 * auVar66._40_8_;
        bVar24 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar61._48_8_ = (ulong)bVar24 * auVar62._48_8_ | (ulong)!bVar24 * auVar66._48_8_;
        auVar61._56_8_ =
             (uVar19 >> 7) * auVar62._56_8_ | (ulong)!SUB81(uVar19 >> 7,0) * auVar66._56_8_;
        auVar57 = vextracti64x4_avx512f(auVar61,1);
        auVar61 = vpaddq_avx512f(auVar61,ZEXT3264(auVar57));
        auVar56 = vpaddq_avx(auVar61._0_16_,auVar61._16_16_);
        auVar55 = vpshufd_avx(auVar56,0xee);
        auVar56 = vpaddq_avx(auVar56,auVar55);
        lVar27 = auVar56._0_8_;
      }
      pxVar31 = (xml_node_struct *)(lVar27 + 1);
      pxVar26 = (xml_node_struct *)
                (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                          allocate)(pxVar31);
      if (pxVar26 == (xml_node_struct *)0x0) goto LAB_00106646;
      pxVar53 = pxVar26;
      if (3 < size) {
        uVar38 = 0;
        do {
          uVar37 = swap_bytes(*(undefined4 *)((long)contents + uVar38 * 4));
          if (uVar37 < 0x10000) {
            pxVar53 = (xml_node_struct *)utf8_writer::low((value_type)pxVar53,uVar37);
          }
          else {
            auVar56 = vpinsrb_avx(ZEXT416(uVar37 >> 0x12),uVar37 >> 0xc & 0xfff3f,1);
            auVar56 = vpinsrb_avx(auVar56,uVar37 >> 6 & 0x3ffff3f,2);
            auVar56 = vpinsrb_avx(auVar56,uVar37 & 0xffffff3f,3);
            auVar23._8_4_ = 0x808080f0;
            auVar23._0_8_ = 0x808080f0808080f0;
            auVar23._12_4_ = 0x808080f0;
            auVar56 = vpord_avx512vl(auVar56,auVar23);
            *(int *)&pxVar53->header = auVar56._0_4_;
            pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 4);
          }
          uVar38 = uVar38 + 1;
        } while (uVar45 != uVar38);
      }
      if (pxVar53 != (xml_node_struct *)((long)&pxVar26->header + lVar27)) {
        __function = 
        "bool pugi::impl::(anonymous namespace)::convert_buffer_generic(char_t *&, size_t &, const void *, size_t, D) [D = pugi::impl::(anonymous namespace)::utf32_decoder<pugi::impl::(anonymous namespace)::opt_true>]"
        ;
        goto LAB_00107f74;
      }
    }
    *(byte *)&pxVar53->header = 0;
    local_a8 = pxVar31;
    local_a0 = pxVar26;
  }
  else {
    if (xVar25 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x8e3,
                    "bool pugi::impl::(anonymous namespace)::convert_buffer(char_t *&, size_t &, xml_encoding, const void *, size_t, bool)"
                   );
    }
    sVar50 = 0;
    if (size == 0) {
LAB_001068d7:
      lVar27 = size - sVar50;
      if (lVar27 != 0) {
        if (lVar27 == 0) {
          lVar44 = 0;
        }
        else {
          auVar61 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar62 = vpbroadcastq_avx512f(ZEXT816(2));
          auVar77 = ZEXT1664((undefined1  [16])0x0);
          auVar56 = vpcmpeqd_avx(auVar56,auVar56);
          auVar63 = vpbroadcastq_avx512f();
          uVar45 = 0;
          do {
            auVar64 = vpbroadcastq_avx512f();
            auVar65 = vmovdqa64_avx512f(auVar77);
            auVar77 = vporq_avx512f(auVar64,auVar61);
            uVar17 = vpcmpuq_avx512f(auVar77,auVar63,2);
            auVar55 = vmovdqu8_avx512vl(*(undefined1 (*) [16])((long)contents + uVar45 + sVar50));
            uVar18 = CONCAT17((char)(uVar17 >> 7) * auVar55[7],
                              CONCAT16(((byte)(uVar17 >> 6) & 1) * auVar55[6],
                                       CONCAT15(((byte)(uVar17 >> 5) & 1) * auVar55[5],
                                                CONCAT14(((byte)(uVar17 >> 4) & 1) * auVar55[4],
                                                         CONCAT13(((byte)(uVar17 >> 3) & 1) *
                                                                  auVar55[3],
                                                                  CONCAT12(((byte)(uVar17 >> 2) & 1)
                                                                           * auVar55[2],
                                                                           CONCAT11(((byte)(uVar17 
                                                  >> 1) & 1) * auVar55[1],
                                                  ((byte)uVar17 & 1) * auVar55[0])))))));
            auVar55._8_8_ = 0;
            auVar55._0_8_ = uVar18;
            uVar45 = uVar45 + 8;
            uVar38 = vpcmpgtb_avx512vl(auVar55,auVar56);
            auVar77._8_4_ = 1;
            auVar77._0_8_ = 1;
            auVar77._12_4_ = 0;
            auVar77._16_8_ = 1;
            auVar77._24_8_ = 1;
            auVar77._32_8_ = 1;
            auVar77._40_8_ = 1;
            auVar77._48_8_ = 1;
            auVar77._56_8_ = 1;
            auVar77 = vpblendmq_avx512f(auVar62,auVar77);
            bVar24 = (bool)((byte)uVar38 & 1);
            auVar64._0_8_ = (ulong)bVar24 * auVar77._0_8_ | !bVar24 * uVar18;
            auVar64._8_8_ = (ulong)((byte)(uVar38 >> 1) & 1) * auVar77._8_8_;
            auVar64._16_8_ = (ulong)((byte)(uVar38 >> 2) & 1) * auVar77._16_8_;
            auVar64._24_8_ = (ulong)((byte)(uVar38 >> 3) & 1) * auVar77._24_8_;
            auVar64._32_8_ = (ulong)((byte)(uVar38 >> 4) & 1) * auVar77._32_8_;
            auVar64._40_8_ = (ulong)((byte)(uVar38 >> 5) & 1) * auVar77._40_8_;
            auVar64._48_8_ = (ulong)((byte)(uVar38 >> 6) & 1) * auVar77._48_8_;
            auVar64._56_8_ = (ulong)((byte)(uVar38 >> 7) & 1) * auVar77._56_8_;
            auVar77 = vpaddq_avx512f(auVar64,auVar65);
          } while ((lVar27 + 7U & 0xfffffffffffffff8) != uVar45);
          auVar61 = vmovdqa64_avx512f(auVar77);
          bVar24 = (bool)((byte)uVar17 & 1);
          auVar62._0_8_ = (ulong)bVar24 * auVar61._0_8_ | (ulong)!bVar24 * auVar65._0_8_;
          bVar24 = (bool)((byte)(uVar17 >> 1) & 1);
          auVar62._8_8_ = (ulong)bVar24 * auVar61._8_8_ | (ulong)!bVar24 * auVar65._8_8_;
          bVar24 = (bool)((byte)(uVar17 >> 2) & 1);
          auVar62._16_8_ = (ulong)bVar24 * auVar61._16_8_ | (ulong)!bVar24 * auVar65._16_8_;
          bVar24 = (bool)((byte)(uVar17 >> 3) & 1);
          auVar62._24_8_ = (ulong)bVar24 * auVar61._24_8_ | (ulong)!bVar24 * auVar65._24_8_;
          bVar24 = (bool)((byte)(uVar17 >> 4) & 1);
          auVar62._32_8_ = (ulong)bVar24 * auVar61._32_8_ | (ulong)!bVar24 * auVar65._32_8_;
          bVar24 = (bool)((byte)(uVar17 >> 5) & 1);
          auVar62._40_8_ = (ulong)bVar24 * auVar61._40_8_ | (ulong)!bVar24 * auVar65._40_8_;
          bVar24 = (bool)((byte)(uVar17 >> 6) & 1);
          auVar62._48_8_ = (ulong)bVar24 * auVar61._48_8_ | (ulong)!bVar24 * auVar65._48_8_;
          auVar62._56_8_ =
               (uVar17 >> 7) * auVar61._56_8_ | (ulong)!SUB81(uVar17 >> 7,0) * auVar65._56_8_;
          auVar57 = vextracti64x4_avx512f(auVar62,1);
          auVar61 = vpaddq_avx512f(auVar62,ZEXT3264(auVar57));
          auVar56 = vpaddq_avx(auVar61._0_16_,auVar61._16_16_);
          auVar55 = vpshufd_avx(auVar56,0xee);
          auVar56 = vpaddq_avx(auVar56,auVar55);
          lVar44 = auVar56._0_8_;
        }
        pxVar31 = (xml_node_struct *)(lVar44 + 1 + sVar50);
        pxVar26 = (xml_node_struct *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)();
        if (pxVar26 == (xml_node_struct *)0x0) goto LAB_00106646;
        lVar44 = lVar44 + sVar50;
        memcpy(pxVar26,contents,sVar50);
        pxVar53 = (xml_node_struct *)((long)&pxVar26->header + sVar50);
        if (lVar27 != 0) {
          do {
            pxVar53 = (xml_node_struct *)
                      utf8_writer::low((value_type)pxVar53,(uint)*(byte *)((long)contents + sVar50))
            ;
            sVar50 = sVar50 + 1;
          } while (size != sVar50);
        }
        if (pxVar53 != (xml_node_struct *)((long)&pxVar26->header + lVar44)) {
          __assert_fail("oend == obegin + length",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0x8bc,
                        "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                       );
        }
        *(byte *)&pxVar53->header = 0;
        local_a8 = pxVar31;
        local_a0 = pxVar26;
        goto LAB_00106ed7;
      }
    }
    else {
      do {
        if (*(char *)((long)contents + sVar50) < '\0') {
          if (size < sVar50) {
            __assert_fail("prefix_length <= data_length",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                          ,0x8a7,
                          "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                         );
          }
          goto LAB_001068d7;
        }
        sVar50 = sVar50 + 1;
      } while (size != sVar50);
    }
LAB_00106625:
    bVar24 = get_mutable_buffer((char_t **)&local_a0,(size_t *)&local_a8,contents,size,is_mutable);
    pxVar53 = (xml_node_struct *)CONCAT71(extraout_var,bVar24);
    if (!bVar24) {
LAB_00106646:
      __return_storage_ptr__->encoding = encoding_auto;
      __return_storage_ptr__->status = status_out_of_memory;
      __return_storage_ptr__->offset = 0;
      return __return_storage_ptr__;
    }
  }
LAB_00106ed7:
  pxVar31 = local_88;
  pxVar26 = local_a0;
  if (own) {
    if (contents != (void *)0x0 && local_a0 != (xml_node_struct *)contents) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (contents);
    }
LAB_00106f22:
    *out_buffer = (char_t *)pxVar26;
    local_90 = (xml_node_struct *)out_buffer;
  }
  else {
    local_90 = pxVar53;
    if (local_a0 != (xml_node_struct *)contents) goto LAB_00106f22;
  }
  doc->buffer = (char_t *)pxVar26;
  xVar25 = (xml_encoding)local_60;
  if (local_a8 != (xml_node_struct *)0x0) {
    if (pxVar31->first_child == (xml_node_struct *)0x0) {
      local_68 = (xml_node_struct *)0x0;
    }
    else {
      local_68 = pxVar31->first_child->prev_sibling_c;
    }
    endch = ((undefined1 *)((long)&pxVar26[-1].first_attribute + 7))[(long)local_a8];
    ((undefined1 *)((long)&pxVar26[-1].first_attribute + 7))[(long)local_a8] = 0;
    pxVar53 = pxVar26;
    if (((byte)pxVar26->header == 0xef) && (*(byte *)((long)&pxVar26->header + 1) == 0xbb)) {
      pxVar53 = (xml_node_struct *)
                ((long)&pxVar26->header + (ulong)(*(byte *)((long)&pxVar26->header + 2) == 0xbf) * 3
                );
    }
    local_58 = &pxVar31->first_child;
    local_40 = local_a8;
    alloc = &doc->super_xml_allocator;
    local_38 = pxVar26;
    local_90 = (xml_node_struct *)((long)&local_a8[-1].first_attribute + 7);
    local_48 = (code *)(&PTR_parse_simple_00122cc8)[options >> 4 & 0xf];
    bVar47 = endch ^ 0x3e;
    local_50 = (code *)(&PTR_parse_00122d48)[(options >> 4 & 3) + (options >> 0xb & 1) * 4];
    local_7c = options & 0x22;
LAB_0010704f:
    do {
      uVar45 = (ulong)(byte)pxVar53->header;
      while( true ) {
        pxVar26 = pxVar53;
        if ((char)uVar45 == '\0') goto LAB_00107c7d;
        if ((int)uVar45 == 0x3c) goto LAB_001070dd;
        bVar33 = (anonymous_namespace)::chartype_table[uVar45];
        pxVar53 = pxVar26;
        while ((bVar33 & 8) != 0) {
          uVar45 = (ulong)*(byte *)((long)&pxVar53->header + 1);
          pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 1);
          bVar33 = (anonymous_namespace)::chartype_table[uVar45];
        }
        if (((char)uVar45 != '<') && (uVar45 != 0)) break;
        if (pxVar26 == pxVar53) {
          __assert_fail("mark != s",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                        ,0xd63,
                        "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                       );
        }
        if (((options >> 0xb & 1) == 0 && (options & 0x408) != 0) &&
           (((options >> 10 & 1) == 0 ||
            ((((char)uVar45 == '<' && (*(byte *)((long)&pxVar53->header + 1) == 0x2f)) &&
             (pxVar31->first_child == (xml_node_struct *)0x0)))))) break;
      }
      if ((options >> 0xb & 1) != 0) {
        pxVar26 = pxVar53;
      }
      if (((options >> 0xc & 1) != 0) || (pxVar31->parent != (xml_node_struct *)0x0)) {
        if ((((options >> 0xd & 1) == 0) ||
            ((pxVar31->parent == (xml_node_struct *)0x0 ||
             (pxVar31->first_child != (xml_node_struct *)0x0)))) ||
           (pxVar31->value != (char_t *)0x0)) {
          pxVar31 = append_new_node(pxVar31,alloc,node_pcdata);
          if (pxVar31 != (xml_node_struct *)0x0) {
            pxVar31->value = (char_t *)pxVar26;
            pxVar31 = pxVar31->parent;
            goto LAB_00107128;
          }
          goto LAB_00107d0e;
        }
        pxVar31->value = (char_t *)pxVar26;
LAB_00107128:
        pxVar26 = (xml_node_struct *)(*local_50)(pxVar26);
        bVar33 = (byte)pxVar26->header;
        if (bVar33 != 0) goto LAB_00107146;
LAB_00107c7d:
        pxVar29 = (xml_node_struct *)0x0;
        if (pxVar31 != local_88) {
          pxVar29 = pxVar26;
        }
        xVar49 = status_end_element_mismatch;
        if (pxVar31 == local_88) {
          xVar49 = status_ok;
        }
        goto LAB_00107dbf;
      }
      while( true ) {
        bVar33 = (byte)pxVar26->header;
        if (bVar33 == 0) goto LAB_00107c7d;
        if (bVar33 == 0x3c) break;
        pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 1);
      }
LAB_001070dd:
      bVar33 = *(byte *)((long)&pxVar26->header + 1);
      pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 1);
LAB_00107146:
      if ((char)(anonymous_namespace)::chartype_table[bVar33] < '\0') {
        pxVar31 = append_new_node(pxVar31,alloc,node_element);
        if (pxVar31 == (xml_node_struct *)0x0) {
LAB_00107ceb:
          xVar49 = status_out_of_memory;
          pxVar29 = pxVar26;
          goto LAB_00107dbf;
        }
        pxVar31->name = (char_t *)pxVar26;
        pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 1);
        do {
          pxVar29 = pxVar26;
          uVar45 = (ulong)*(byte *)((long)&pxVar29[-1].first_attribute + 7);
          bVar33 = (anonymous_namespace)::chartype_table[uVar45];
          if ((bVar33 & 0x40) == 0) {
            pxVar29 = (xml_node_struct *)((long)&pxVar29[-1].first_attribute + 7);
            goto LAB_00107550;
          }
          uVar45 = (ulong)(byte)pxVar29->header;
          bVar33 = (anonymous_namespace)::chartype_table[uVar45];
          if ((bVar33 & 0x40) == 0) goto LAB_00107550;
          uVar45 = (ulong)*(byte *)((long)&pxVar29->header + 1);
          bVar33 = (anonymous_namespace)::chartype_table[uVar45];
          if ((bVar33 & 0x40) == 0) {
            pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 1);
            goto LAB_00107550;
          }
          uVar45 = (ulong)*(byte *)((long)&pxVar29->header + 2);
          bVar33 = (anonymous_namespace)::chartype_table[uVar45];
          pxVar26 = (xml_node_struct *)((long)&pxVar29->header + 4);
        } while ((bVar33 & 0x40) != 0);
        pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 2);
LAB_00107550:
        pxVar53 = (xml_node_struct *)((long)&pxVar29->header + 1);
        *(byte *)&pxVar29->header = 0;
        if ((char)uVar45 != '>') {
          if ((bVar33 & 8) != 0) goto LAB_001079f8;
          xVar49 = status_bad_start_element;
          if ((char)uVar45 == '\0') {
            pxVar53 = pxVar29;
            if (endch != 0x3e) goto LAB_00107dbf;
          }
          else {
            pxVar29 = pxVar53;
            if ((int)uVar45 != 0x2f) goto LAB_00107dbf;
            bVar33 = (byte)pxVar53->header;
            if ((bVar33 != 0x3e) && (bVar47 != 0 || bVar33 != 0)) goto LAB_00107dbf;
            pxVar31 = pxVar31->parent;
            pxVar53 = (xml_node_struct *)((long)&pxVar53->header + (ulong)(bVar33 == 0x3e));
          }
        }
        goto LAB_0010704f;
      }
      if (bVar33 == 0x21) {
        bVar33 = *(byte *)((long)&pxVar26->header + 1);
        if (bVar33 == 0x5b) {
          if (*(byte *)((long)&pxVar26->header + 2) == 0x43) {
            if (*(byte *)((long)&pxVar26->header + 3) != 0x44) {
              pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 3);
              goto LAB_00107db6;
            }
            if (*(byte *)((long)&pxVar26->header + 4) != 0x41) {
              pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 4);
              goto LAB_00107db6;
            }
            if (*(byte *)((long)&pxVar26->header + 5) != 0x54) {
              pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 5);
              goto LAB_00107db6;
            }
            if (*(byte *)((long)&pxVar26->header + 6) != 0x41) {
              pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 6);
              goto LAB_00107db6;
            }
            if (*(byte *)((long)&pxVar26->header + 7) != 0x5b) {
              pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 7);
              goto LAB_00107db6;
            }
            pxVar26 = (xml_node_struct *)&pxVar26->name;
            if ((options & 4) == 0) {
              do {
                if (*(byte *)&pxVar26->header == 0x5d) {
                  if (*(byte *)((long)&pxVar26->header + 1) == 0x5d) {
                    bVar33 = *(byte *)((long)&pxVar26->header + 2);
                    if ((bVar33 == 0x3e) || (bVar47 == 0 && bVar33 == 0)) goto LAB_00107bab;
                  }
                }
                else if (*(byte *)&pxVar26->header == 0) goto LAB_00107db6;
                pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 1);
              } while( true );
            }
            pxVar53 = append_new_node(pxVar31,alloc,node_cdata);
            if (pxVar53 == (xml_node_struct *)0x0) goto LAB_00107ceb;
            pxVar53->value = (char_t *)pxVar26;
            if ((options & 0x20) == 0) {
              do {
                if (*(byte *)&pxVar26->header == 0x5d) {
                  if (*(byte *)((long)&pxVar26->header + 1) == 0x5d) {
                    bVar33 = *(byte *)((long)&pxVar26->header + 2);
                    if ((bVar33 == 0x3e) || (bVar47 == 0 && bVar33 == 0)) goto LAB_00107ba6;
                  }
                }
                else if (*(byte *)&pxVar26->header == 0) goto LAB_00107db6;
                pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 1);
              } while( true );
            }
            pbVar40 = strconv_cdata((char_t *)pxVar26,endch);
            if (pbVar40 != (byte *)0x0) goto LAB_00107bae;
            pxVar29 = (xml_node_struct *)pxVar53->value;
            xVar49 = status_bad_cdata;
          }
          else {
            pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 2);
LAB_00107db6:
            xVar49 = status_bad_cdata;
            pxVar29 = pxVar26;
          }
        }
        else {
          pxVar53 = (xml_node_struct *)((long)&pxVar26->header + 1);
          pxVar29 = pxVar53;
          if (bVar33 == 0x44) {
            xVar49 = status_unrecognized_tag;
            if ((((*(byte *)((long)&pxVar26->header + 2) == 0x4f) &&
                 (*(byte *)((long)&pxVar26->header + 3) == 0x43)) &&
                (*(byte *)((long)&pxVar26->header + 4) == 0x54)) &&
               ((*(byte *)((long)&pxVar26->header + 5) == 0x59 &&
                (*(byte *)((long)&pxVar26->header + 6) == 0x50)))) {
              bVar33 = *(byte *)((long)&pxVar26->header + 7);
              if ((bVar33 == 0x45) || (endch == 0x45 && bVar33 == 0)) {
                pxVar29 = (xml_node_struct *)((long)&pxVar26[-1].first_attribute + 7);
                xVar49 = status_bad_doctype;
                xVar48 = status_bad_doctype;
                if (pxVar31->parent == (xml_node_struct *)0x0) {
                  bVar33 = (byte)pxVar29->header;
                  if ((bVar33 != 0x3c) && (bVar33 != 0)) {
                    __assert_fail("(s[0] == \'<\' || s[0] == 0) && s[1] == \'!\'",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                                  ,0xbb5,
                                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_doctype_group(char_t *, char_t)"
                                 );
                  }
                  bVar33 = 0x44;
                  lVar27 = 0;
LAB_001076bb:
                  pxVar29 = pxVar53;
                  xVar49 = xVar48;
                  if (bVar33 < 0x3c) {
                    if ((bVar33 != 0x22) && (bVar33 != 0x27)) {
                      if (bVar33 == 0) goto LAB_00107be5;
LAB_00107798:
                      pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 1);
                      goto LAB_0010779b;
                    }
                    pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 1);
                    do {
                      pxVar29 = pxVar53;
                      bVar34 = (byte)pxVar29->header;
                      pxVar53 = (xml_node_struct *)((long)&pxVar29->header + 1);
                      if (bVar34 == 0) break;
                    } while (bVar34 != bVar33);
                    if (bVar34 == 0) goto LAB_00107dbf;
                  }
                  else {
                    if (bVar33 != 0x3c) {
                      if (bVar33 != 0x3e) goto LAB_00107798;
                      if (lVar27 == 0) {
                        *(byte *)&pxVar53->header = 0;
                        pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 1);
                        goto LAB_00107c01;
                      }
                      lVar27 = lVar27 + -1;
                      goto LAB_00107798;
                    }
                    bVar33 = *(byte *)((long)&pxVar53->header + 1);
                    if (bVar33 == 0x3f) {
                      pxVar29 = (xml_node_struct *)((long)&pxVar53->header + 2);
                      do {
                        bVar33 = (byte)pxVar29->header;
                        if (bVar33 == 0x3f) {
                          if (*(byte *)((long)&pxVar29->header + 1) == 0x3e) goto LAB_001077c5;
                        }
                        else if (bVar33 == 0) goto LAB_00107dbf;
                        pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 1);
                      } while( true );
                    }
                    if (bVar33 != 0x21) goto LAB_00107dbf;
                    bVar33 = *(byte *)((long)&pxVar53->header + 2);
                    if (bVar33 == 0x2d) {
                      if (*(byte *)((long)&pxVar53->header + 3) == 0x2d) {
                        pxVar29 = (xml_node_struct *)((long)&pxVar53->header + 4);
                        do {
                          bVar33 = (byte)pxVar29->header;
                          if (bVar33 == 0x2d) {
                            if ((*(byte *)((long)&pxVar29->header + 1) == 0x2d) &&
                               (*(byte *)((long)&pxVar29->header + 2) == 0x3e)) goto LAB_00107808;
                          }
                          else if (bVar33 == 0) break;
                          pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 1);
                        } while( true );
                      }
                      goto LAB_00107dbf;
                    }
                    if (bVar33 == 0x5b) {
                      pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 3);
                      lVar44 = 0;
LAB_00107742:
                      pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 3);
                      do {
                        cVar2 = *(char *)((long)&pxVar53[-1].first_attribute + 5);
                        if (cVar2 == '<') {
                          if ((*(char *)((long)&pxVar53[-1].first_attribute + 6) == '!') &&
                             (*(char *)((long)&pxVar53[-1].first_attribute + 7) == '[')) {
                            lVar44 = lVar44 + 1;
                            goto LAB_00107742;
                          }
                        }
                        else if (cVar2 == ']') {
                          if ((*(char *)((long)&pxVar53[-1].first_attribute + 6) == ']') &&
                             (*(char *)((long)&pxVar53[-1].first_attribute + 7) == '>'))
                          goto LAB_00107781;
                        }
                        else if (cVar2 == '\0') {
                          pxVar29 = (xml_node_struct *)((long)&pxVar53[-1].first_attribute + 5);
                          goto LAB_00107dbf;
                        }
                        pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 1);
                      } while( true );
                    }
                    pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 2);
                    lVar27 = lVar27 + 1;
                  }
                  goto LAB_0010779b;
                }
              }
            }
          }
          else if (bVar33 == 0x2d) {
            if (*(byte *)((long)&pxVar26->header + 2) == 0x2d) {
              pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 3);
              pxVar53 = pxVar31;
              if ((options & 2) == 0) {
LAB_00107376:
                if (local_7c != 0x22) {
                  do {
                    bVar33 = (byte)pxVar26->header;
                    if (bVar33 == 0x2d) {
                      if (*(byte *)((long)&pxVar26->header + 1) == 0x2d) {
                        bVar33 = *(byte *)((long)&pxVar26->header + 2);
                        if ((bVar33 == 0x3e) || (bVar47 == 0 && bVar33 == 0)) goto LAB_00107b2e;
                      }
                    }
                    else if (bVar33 == 0) goto LAB_00107d92;
                    pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 1);
                  } while( true );
                }
                local_78.end = (char_t *)0x0;
                local_78.size = 0;
                local_98 = pxVar31;
LAB_00107393:
                do {
                  pxVar29 = pxVar26;
                  sVar50 = local_78.size;
                  bVar33 = (byte)pxVar29->header;
                  if (((anonymous_namespace)::chartype_table[bVar33] & 0x20) == 0) {
                    pxVar31 = (xml_node_struct *)((long)&pxVar29->header + 2);
                    do {
                      pxVar29 = pxVar31;
                      bVar33 = *(byte *)((long)&pxVar29[-1].first_attribute + 7);
                      if (((anonymous_namespace)::chartype_table[bVar33] & 0x20) != 0) {
                        pxVar29 = (xml_node_struct *)((long)&pxVar29[-1].first_attribute + 7);
                        goto LAB_001073ea;
                      }
                      bVar33 = (byte)pxVar29->header;
                      if (((anonymous_namespace)::chartype_table[bVar33] & 0x20) != 0)
                      goto LAB_001073ea;
                      bVar33 = *(byte *)((long)&pxVar29->header + 1);
                      if (((anonymous_namespace)::chartype_table[bVar33] & 0x20) != 0) {
                        pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 1);
                        goto LAB_001073ea;
                      }
                      bVar33 = *(byte *)((long)&pxVar29->header + 2);
                      pxVar31 = (xml_node_struct *)((long)&pxVar29->header + 4);
                    } while (((anonymous_namespace)::chartype_table[bVar33] & 0x20) == 0);
                    pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 2);
                  }
LAB_001073ea:
                  if (bVar33 == 0xd) {
                    *(byte *)&pxVar29->header = 10;
                    pxVar26 = (xml_node_struct *)((long)&pxVar29->header + 1);
                    if (*(byte *)((long)&pxVar29->header + 1) == 10) {
                      if ((xml_node_struct *)local_78.end != (xml_node_struct *)0x0) {
                        if (pxVar26 < local_78.end) {
                          __assert_fail("s >= end",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                                        ,0x974,
                                        "void pugi::impl::(anonymous namespace)::gap::push(char_t *&, size_t)"
                                       );
                        }
                        memmove((void *)((long)local_78.end - local_78.size),local_78.end,
                                (long)pxVar26 - (long)local_78.end);
                      }
                      local_78.end = (char_t *)((long)&pxVar29->header + 2);
                      local_78.size = sVar50 + 1;
                      pxVar26 = (xml_node_struct *)local_78.end;
                    }
                    goto LAB_00107393;
                  }
                  if (bVar33 == 0x2d) {
                    if ((*(byte *)((long)&pxVar29->header + 1) == 0x2d) &&
                       ((bVar33 = *(byte *)((long)&pxVar29->header + 2), bVar33 == 0x3e ||
                        (bVar47 == 0 && bVar33 == 0)))) goto LAB_00107b4a;
                  }
                  else if (bVar33 == 0) {
                    pxVar29 = (xml_node_struct *)pxVar53->value;
                    xVar49 = status_bad_comment;
                    goto LAB_00107dbf;
                  }
                  pxVar26 = (xml_node_struct *)((long)&pxVar29->header + 1);
                } while( true );
              }
              pxVar53 = append_new_node(pxVar31,alloc,node_comment);
              if (pxVar53 != (xml_node_struct *)0x0) {
                pxVar53->value = (char_t *)pxVar26;
                goto LAB_00107376;
              }
              goto LAB_00107ceb;
            }
            pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 2);
LAB_00107d92:
            xVar49 = status_bad_comment;
            pxVar29 = pxVar26;
          }
          else if ((endch != 0x2d) || (xVar49 = status_bad_comment, bVar33 != 0)) {
            xVar49 = (uint)(endch == 0x5b && bVar33 == 0) * 3 + status_unrecognized_tag;
          }
        }
        goto LAB_00107dbf;
      }
      if (bVar33 == 0x3f) {
        bVar33 = *(byte *)((long)&pxVar26->header + 1);
        pxVar1 = (xml_node_struct *)((long)&pxVar26->header + 1);
        pxVar29 = pxVar1;
        xVar49 = status_bad_pi;
        if (-1 < (char)(anonymous_namespace)::chartype_table[bVar33]) goto LAB_00107dbf;
        lVar44 = 4;
        pbVar40 = (byte *)((long)&pxVar26->header + 3);
        lVar27 = 1;
        pxVar51 = (xml_node_struct *)((long)&pxVar26->header + 1);
        do {
          pxVar53 = pxVar51;
          lVar67 = lVar27;
          pbVar39 = pbVar40;
          bVar34 = (byte)pxVar53->header;
          uVar45 = (ulong)bVar34;
          lVar44 = lVar44 + -1;
          pxVar51 = (xml_node_struct *)((long)&pxVar53->header + 1);
          pbVar40 = pbVar39 + 1;
          lVar27 = lVar67 + 1;
        } while (((anonymous_namespace)::chartype_table[uVar45] & 0x40) != 0);
        pxVar29 = pxVar53;
        local_98 = pxVar1;
        if (bVar34 != 0) {
          pxVar29 = (xml_node_struct *)((long)&pxVar26->header + lVar67);
          if (((bVar33 & 0xdf) == 0x58) && ((pxVar26->header & 0xdf0000) == 0x4d0000)) {
            bVar24 = (pxVar26->header & 0xdf000000) != 0x4c000000;
            uVar37 = 1;
            if (lVar44 == 0 && !bVar24) {
              uVar37 = 0x100;
            }
            if ((options & uVar37) == 0) {
LAB_001074df:
              do {
                if ((char)uVar45 == '?') {
                  bVar33 = *(byte *)((long)&pxVar53->header + 1);
                  if ((bVar33 == 0x3e) || (bVar47 == 0 && bVar33 == 0)) goto LAB_00107921;
                }
                else {
                  pxVar29 = pxVar53;
                  xVar49 = status_bad_pi;
                  if ((int)uVar45 == 0) goto LAB_00107dbf;
                  bVar33 = *(byte *)((long)&pxVar53->header + 1);
                }
                uVar45 = (ulong)bVar33;
                pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 1);
              } while( true );
            }
            if (lVar44 != 0 || bVar24) goto LAB_001075af;
            xVar49 = status_bad_pi;
            if (pxVar31->parent != (xml_node_struct *)0x0) goto LAB_00107dbf;
            pxVar31 = append_new_node(pxVar31,alloc,node_declaration);
            if (pxVar31 == (xml_node_struct *)0x0) goto LAB_00107d42;
            bVar24 = true;
          }
          else {
            if ((options & 1) == 0) goto LAB_001074df;
LAB_001075af:
            pxVar31 = append_new_node(pxVar31,alloc,node_pi);
            if (pxVar31 == (xml_node_struct *)0x0) {
LAB_00107d42:
              xVar49 = status_out_of_memory;
              goto LAB_00107dbf;
            }
            bVar24 = false;
          }
          xVar49 = status_bad_pi;
          pxVar31->name = (char_t *)local_98;
          uVar45 = (ulong)(byte)pxVar53->header;
          *(byte *)&pxVar53->header = 0;
          if (uVar45 != 0x3f) {
            pxVar29 = pxVar51;
            if (((anonymous_namespace)::chartype_table[uVar45] & 8) != 0) {
              do {
                pbVar40 = pbVar39;
                uVar45 = (ulong)*(byte *)((long)&pxVar53->header + 1);
                pxVar53 = (xml_node_struct *)((long)&pxVar53->header + 1);
                pbVar39 = pbVar40 + 1;
              } while (((anonymous_namespace)::chartype_table[uVar45] & 8) != 0);
              do {
                if ((char)uVar45 == '?') {
                  bVar33 = *pbVar40;
                  if ((bVar33 == 0x3e) || (bVar47 == 0 && bVar33 == 0)) goto LAB_001079b0;
                }
                else {
                  if ((int)uVar45 == 0) {
                    pxVar29 = (xml_node_struct *)(pbVar40 + -1);
                    xVar49 = status_bad_pi;
                    goto LAB_00107dbf;
                  }
                  bVar33 = *pbVar40;
                }
                uVar45 = (ulong)bVar33;
                pbVar40 = pbVar40 + 1;
              } while( true );
            }
            goto LAB_00107d35;
          }
          bVar33 = (byte)pxVar51->header;
          if ((bVar33 == 0x3e) || (bVar47 == 0 && bVar33 == 0)) {
            pxVar31 = pxVar31->parent;
            pxVar53 = (xml_node_struct *)((long)&pxVar51->header + (ulong)(bVar33 == 0x3e));
            goto LAB_001079df;
          }
          pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 1);
          goto LAB_00107dbf;
        }
LAB_00107d35:
        xVar49 = status_bad_pi;
        goto LAB_00107dbf;
      }
      if (bVar33 != 0x2f) {
        xVar49 = (endch == 0x3f && bVar33 == 0) + status_unrecognized_tag;
        pxVar29 = pxVar26;
        goto LAB_00107dbf;
      }
      pbVar40 = pxVar31->name;
      pxVar29 = (xml_node_struct *)((long)&pxVar26->header + 1);
      xVar49 = status_end_element_mismatch;
      pxVar26 = pxVar29;
      if (pbVar40 == (byte *)0x0) goto LAB_00107dbf;
      while (bVar33 = (byte)pxVar26->header,
            ((anonymous_namespace)::chartype_table[bVar33] & 0x40) != 0) {
        bVar34 = *pbVar40;
        pbVar40 = pbVar40 + 1;
        pxVar26 = (xml_node_struct *)((long)&pxVar26->header + 1);
        if (bVar33 != bVar34) goto LAB_00107dbf;
      }
      if (*pbVar40 != 0) {
        if (((bVar33 == 0) && (*pbVar40 == endch)) && (pbVar40[1] == 0)) {
LAB_00107e89:
          pxVar29 = pxVar26;
          xVar49 = status_bad_end_element;
        }
        goto LAB_00107dbf;
      }
      pxVar53 = pxVar26;
      do {
        pxVar26 = pxVar53;
        bVar33 = (byte)pxVar26->header;
        pxVar53 = (xml_node_struct *)((long)&pxVar26->header + 1);
      } while (((anonymous_namespace)::chartype_table[bVar33] & 8) != 0);
      if (bVar33 == 0) goto LAB_001078fb;
      pxVar31 = pxVar31->parent;
      if (bVar33 != 0x3e) goto LAB_00107e89;
    } while( true );
  }
  __return_storage_ptr__->status = ~options >> 8 & status_no_document_element;
  __return_storage_ptr__->offset = 0;
LAB_00107e70:
  __return_storage_ptr__->encoding = xVar25;
  return (xml_parse_result *)local_90;
LAB_00107ba6:
  *(byte *)&pxVar26->header = 0;
LAB_00107bab:
  pbVar40 = (byte *)((long)&pxVar26->header + 1);
LAB_00107bae:
  pxVar53 = (xml_node_struct *)(pbVar40 + (ulong)(pbVar40[1] == 0x3e) + 1);
  goto LAB_0010704f;
LAB_001077c5:
  pxVar53 = (xml_node_struct *)((long)&pxVar29->header + 2);
  goto LAB_0010779b;
LAB_00107808:
  pxVar53 = (xml_node_struct *)((long)&pxVar29->header + 3);
LAB_0010779b:
  bVar33 = (byte)pxVar53->header;
  goto LAB_001076bb;
LAB_00107781:
  if (lVar44 != 0) {
    lVar44 = lVar44 + -1;
    goto LAB_00107742;
  }
  goto LAB_0010779b;
LAB_00107be5:
  if ((endch != 0x3e) || (lVar27 != 0)) goto LAB_00107dbf;
LAB_00107c01:
  if ((options >> 9 & 1) != 0) {
    pbVar40 = (byte *)((long)&pxVar26->header + 7);
    do {
      pbVar39 = pbVar40 + 1;
      pbVar40 = pbVar40 + 1;
    } while (((anonymous_namespace)::chartype_table[*pbVar39] & 8) != 0);
    pxVar29 = append_new_node(pxVar31,alloc,node_doctype);
    pxVar26 = pxVar53;
    if (pxVar29 == (xml_node_struct *)0x0) {
LAB_00107d0e:
      pxVar29 = pxVar26;
      xVar49 = status_out_of_memory;
      goto LAB_00107dbf;
    }
    pxVar29->value = pbVar40;
  }
  goto LAB_0010704f;
LAB_00107b2e:
  if ((options & 2) != 0) {
    *(byte *)&pxVar26->header = 0;
  }
  pxVar53 = (xml_node_struct *)((long)&pxVar26->header + (ulong)(bVar33 == 0x3e) + 2);
  goto LAB_0010704f;
LAB_00107b4a:
  pcVar30 = gap::flush(&local_78,(char_t *)pxVar29);
  *pcVar30 = '\0';
  pxVar31 = local_98;
  pxVar53 = (xml_node_struct *)
            ((long)&pxVar29->header + (ulong)(*(byte *)((long)&pxVar29->header + 2) == 0x3e) + 2);
  goto LAB_0010704f;
LAB_00107921:
  pxVar53 = (xml_node_struct *)((long)&pxVar53->header + (ulong)(bVar33 == 0x3e) + 1);
  goto LAB_001079df;
LAB_001079b0:
  if (bVar24) {
    pbVar40[-1] = 0x2f;
    goto LAB_001079e8;
  }
  pxVar31->value = (char_t *)pxVar53;
  pxVar31 = pxVar31->parent;
  pbVar40[-1] = 0;
  pxVar53 = (xml_node_struct *)(pbVar40 + (*pbVar40 == 0x3e));
LAB_001079df:
  if (pxVar31 == (xml_node_struct *)0x0) {
    __assert_fail("cursor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0xd4f,
                  "char_t *pugi::impl::(anonymous namespace)::xml_parser::parse_tree(char_t *, xml_node_struct *, unsigned int, char_t)"
                 );
  }
LAB_001079e8:
  if ((pxVar31->header & 0xf) == 7) {
LAB_001079f8:
    while( true ) {
      do {
        pxVar29 = pxVar53;
        bVar33 = (byte)pxVar29->header;
        pxVar53 = (xml_node_struct *)((long)&pxVar29->header + 1);
      } while (((anonymous_namespace)::chartype_table[bVar33] & 8) != 0);
      if (-1 < (char)(anonymous_namespace)::chartype_table[bVar33]) break;
      pxVar28 = append_new_attribute(pxVar31,alloc);
      if (pxVar28 == (xml_attribute_struct *)0x0) {
        xVar49 = status_out_of_memory;
        goto LAB_00107dbf;
      }
      pxVar28->name = (char_t *)pxVar29;
      pxVar26 = (xml_node_struct *)((long)&pxVar29->header + 1);
      do {
        pxVar29 = pxVar26;
        bVar33 = *(byte *)((long)&pxVar29[-1].first_attribute + 7);
        bVar34 = (anonymous_namespace)::chartype_table[bVar33];
        if ((bVar34 & 0x40) == 0) {
          pxVar29 = (xml_node_struct *)((long)&pxVar29[-1].first_attribute + 7);
          goto LAB_00107a7b;
        }
        bVar33 = (byte)pxVar29->header;
        bVar34 = (anonymous_namespace)::chartype_table[bVar33];
        if ((bVar34 & 0x40) == 0) goto LAB_00107a7b;
        bVar33 = *(byte *)((long)&pxVar29->header + 1);
        bVar34 = (anonymous_namespace)::chartype_table[bVar33];
        if ((bVar34 & 0x40) == 0) {
          pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 1);
          goto LAB_00107a7b;
        }
        bVar33 = *(byte *)((long)&pxVar29->header + 2);
        bVar34 = (anonymous_namespace)::chartype_table[bVar33];
        pxVar26 = (xml_node_struct *)((long)&pxVar29->header + 4);
      } while ((bVar34 & 0x40) != 0);
      pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 2);
LAB_00107a7b:
      *(byte *)&pxVar29->header = 0;
      while (pxVar29 = (xml_node_struct *)((long)&pxVar29->header + 1), (bVar34 & 8) != 0) {
        bVar33 = (byte)pxVar29->header;
        bVar34 = (anonymous_namespace)::chartype_table[bVar33];
      }
      xVar49 = status_bad_attribute;
      pxVar26 = pxVar29;
      if (bVar33 != 0x3d) goto LAB_00107dbf;
      do {
        pxVar29 = pxVar26;
        bVar33 = (byte)pxVar29->header;
        pxVar26 = (xml_node_struct *)((long)&pxVar29->header + 1);
      } while (((anonymous_namespace)::chartype_table[bVar33] & 8) != 0);
      if ((bVar33 != 0x22) && (bVar33 != 0x27)) goto LAB_00107dbf;
      pxVar28->value = (char_t *)pxVar26;
      pxVar29 = (xml_node_struct *)(*local_48)(pxVar26);
      if (pxVar29 == (xml_node_struct *)0x0) {
        pxVar29 = (xml_node_struct *)pxVar28->value;
        xVar49 = status_bad_attribute;
        goto LAB_00107dbf;
      }
      pxVar53 = pxVar29;
      xVar49 = status_bad_attribute;
      if ((char)(anonymous_namespace)::chartype_table[(byte)pxVar29->header] < '\0')
      goto LAB_00107dbf;
    }
    if (bVar33 != 0x3e) {
      if (bVar33 == 0x2f) {
        bVar33 = (byte)pxVar53->header;
        if (bVar33 == 0x3e) {
          pxVar31 = pxVar31->parent;
          pxVar53 = (xml_node_struct *)((long)&pxVar29->header + 2);
        }
        else {
          pxVar29 = pxVar53;
          xVar49 = status_bad_start_element;
          if ((endch != 0x3e) || (bVar33 != 0)) goto LAB_00107dbf;
          pxVar31 = pxVar31->parent;
        }
      }
      else {
        xVar49 = status_bad_start_element;
        if ((endch != 0x3e) || (pxVar53 = pxVar29, xVar49 = status_bad_start_element, bVar33 != 0))
        goto LAB_00107dbf;
      }
    }
  }
  goto LAB_0010704f;
LAB_001078fb:
  pxVar31 = pxVar31->parent;
  pxVar53 = pxVar26;
  if (endch != 0x3e) goto LAB_00107e9f;
  goto LAB_0010704f;
LAB_00107e9f:
  xVar49 = status_bad_end_element;
  pxVar29 = pxVar26;
LAB_00107dbf:
  pxVar31 = (xml_node_struct *)((long)pxVar29 - (long)local_38);
  if (pxVar29 != (xml_node_struct *)0x0) {
    pxVar29 = pxVar31;
  }
  if (((long)pxVar29 < 0) || (local_40 < pxVar29)) {
    __assert_fail("result.offset >= 0 && static_cast<size_t>(result.offset) <= length",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0xdc8,
                  "static xml_parse_result pugi::impl::(anonymous namespace)::xml_parser::parse(char_t *, size_t, xml_document_struct *, xml_node_struct *, unsigned int)"
                 );
  }
  xVar25 = (xml_encoding)local_60;
  if (xVar49 == status_ok) {
    if (endch == 0x3c) {
      __return_storage_ptr__->status = status_unrecognized_tag;
    }
    else {
      pxVar26 = pxVar29;
      if ((options >> 0xc & 1) != 0) goto LAB_00107e57;
      ppxVar32 = &local_68->next_sibling;
      if (local_68 == (xml_node_struct *)0x0) {
        ppxVar32 = local_58;
      }
      for (pxVar31 = *ppxVar32; pxVar31 != (xml_node_struct *)0x0; pxVar31 = pxVar31->next_sibling)
      {
        if ((pxVar31->header & 0xf) == 2) goto LAB_00107e57;
      }
      __return_storage_ptr__->status = status_no_document_element;
    }
    __return_storage_ptr__->offset = (ptrdiff_t)local_90;
  }
  else {
    if (pxVar29 == (xml_node_struct *)0x0) {
      pxVar26 = (xml_node_struct *)0x0;
    }
    else {
      pxVar26 = (xml_node_struct *)((long)&pxVar29[-1].first_attribute + 7);
      if (endch != 0) {
        pxVar26 = pxVar31;
      }
      if (pxVar29 != local_90) {
        pxVar26 = pxVar31;
      }
    }
LAB_00107e57:
    __return_storage_ptr__->status = xVar49;
    __return_storage_ptr__->offset = (ptrdiff_t)pxVar26;
    local_90 = pxVar31;
  }
  goto LAB_00107e70;
}

Assistant:

PUGI__FN xml_parse_result load_buffer_impl(xml_document_struct* doc, xml_node_struct* root, void* contents, size_t size, unsigned int options, xml_encoding encoding, bool is_mutable, bool own, char_t** out_buffer)
	{
		// check input buffer
		if (!contents && size) return make_parse_result(status_io_error);

		// get actual encoding
		xml_encoding buffer_encoding = impl::get_buffer_encoding(encoding, contents, size);

		// get private buffer
		char_t* buffer = 0;
		size_t length = 0;

		// coverity[var_deref_model]
		if (!impl::convert_buffer(buffer, length, buffer_encoding, contents, size, is_mutable)) return impl::make_parse_result(status_out_of_memory);

		// delete original buffer if we performed a conversion
		if (own && buffer != contents && contents) impl::xml_memory::deallocate(contents);

		// grab onto buffer if it's our buffer, user is responsible for deallocating contents himself
		if (own || buffer != contents) *out_buffer = buffer;

		// store buffer for offset_debug
		doc->buffer = buffer;

		// parse
		xml_parse_result res = impl::xml_parser::parse(buffer, length, doc, root, options);

		// remember encoding
		res.encoding = buffer_encoding;

		return res;
	}